

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGrid.cpp
# Opt level: O0

void __thiscall PatternGrid::mousePressEvent(PatternGrid *this,QMouseEvent *evt)

{
  PatternAnchor cursor_00;
  PatternCursor pos;
  undefined4 uVar1;
  bool bVar2;
  MouseButton MVar3;
  int iVar4;
  int iVar5;
  PatternCursorBase PVar6;
  Iterator local_b0;
  PatternCursorBase local_98;
  PatternCursorBase local_88;
  PatternCursorBase local_78;
  PatternCursorBase local_6c;
  undefined1 local_60 [8];
  PatternSelection selection;
  int local_40;
  undefined1 local_30 [8];
  PatternCursor cursor;
  int row;
  QMouseEvent *evt_local;
  PatternGrid *this_local;
  
  MVar3 = QSinglePointEvent::button((QSinglePointEvent *)evt);
  if (MVar3 == LeftButton) {
    register0x00000000 = QMouseEvent::pos(evt);
    this->mMousePos = register0x00000000;
    iVar4 = QPoint::x(&this->mMousePos);
    iVar5 = PatternLayout::patternStart(&this->mLayout);
    if (iVar4 < iVar5) {
      PatternModel::deselect(this->mModel);
      iVar4 = QPoint::y(&this->mMousePos);
      cursor.super_PatternCursorBase.column = mouseToRow(this,iVar4);
      bVar2 = rowIsValid(this,cursor.super_PatternCursorBase.column);
      if (bVar2) {
        this->mMouseOp = selectingRows;
        PatternModel::selectRow(this->mModel,cursor.super_PatternCursorBase.column);
      }
    }
    else {
      PVar6 = (PatternCursorBase)mouseToCursor(this,this->mMousePos);
      selection.mEnd.super_PatternCursorBase._4_8_ = PVar6._0_8_;
      local_30._0_4_ = selection.mEnd.super_PatternCursorBase.column;
      local_30._4_4_ = selection.mEnd.super_PatternCursorBase.track;
      local_40 = PVar6.track;
      cursor.super_PatternCursorBase.row = local_40;
      unique0x100002a4 = PVar6;
      bVar2 = PatternCursor::isValid((PatternCursor *)local_30);
      if (bVar2) {
        bVar2 = rowIsValid(this,local_30._0_4_);
        if (bVar2) {
          (this->mSelectionStart).super_PatternCursorBase.row = local_30._0_4_;
          (this->mSelectionStart).super_PatternCursorBase.column = local_30._4_4_;
          (this->mSelectionStart).super_PatternCursorBase.track = cursor.super_PatternCursorBase.row
          ;
          bVar2 = PatternModel::hasSelection(this->mModel);
          if (bVar2) {
            PatternModel::selection((PatternSelection *)local_60,this->mModel);
            local_78.row = local_30._0_4_;
            local_78.column = local_30._4_4_;
            local_78.track = cursor.super_PatternCursorBase.row;
            local_88.row = local_30._0_4_;
            local_88.column = local_30._4_4_;
            local_88.track = cursor.super_PatternCursorBase.row;
            pos.super_PatternCursorBase.track = cursor.super_PatternCursorBase.row;
            pos.super_PatternCursorBase.row = local_30._0_4_;
            pos.super_PatternCursorBase.column = local_30._4_4_;
            PatternAnchor::PatternAnchor((PatternAnchor *)&local_6c,pos);
            local_98.row = local_6c.row;
            local_98.column = local_6c.column;
            local_98.track = local_6c.track;
            cursor_00.super_PatternCursorBase.track = local_6c.track;
            cursor_00.super_PatternCursorBase.row = local_6c.row;
            cursor_00.super_PatternCursorBase.column = local_6c.column;
            bVar2 = PatternSelection::contains((PatternSelection *)local_60,cursor_00);
            if (bVar2) {
              this->mMouseOp = dragging;
              uVar1 = local_30._0_4_;
              PatternSelection::iterator(&local_b0,(PatternSelection *)local_60);
              iVar4 = PatternSelection::Iterator::rowStart(&local_b0);
              this->mDragRow = uVar1 - iVar4;
              return;
            }
          }
          PatternModel::deselect(this->mModel);
          this->mMouseOp = beginSelecting;
        }
      }
    }
  }
  return;
}

Assistant:

void PatternGrid::mousePressEvent(QMouseEvent *evt) {
    if (evt->button() == Qt::LeftButton) {

        mMousePos = evt->pos();

        if (mMousePos.x() < mLayout.patternStart()) {
            // select whole rows instead of cells
            mModel.deselect();
            int row = mouseToRow(mMousePos.y());
            if (rowIsValid(row)) {
                mMouseOp = MouseOperation::selectingRows;
                mModel.selectRow(row);
            }
        } else {
            // now convert the mouse coordinates to a coordinate on the grid
            auto cursor = mouseToCursor(mMousePos);
            if (cursor.isValid() && rowIsValid(cursor.row)) {
                mSelectionStart = cursor;

                if (mModel.hasSelection()) {
                    // check if the mouse is within the selection rectangle
                    auto selection = mModel.selection();
                    if (selection.contains(cursor)) {
                        mMouseOp = MouseOperation::dragging;
                        mDragRow = cursor.row - selection.iterator().rowStart();
                        return;
                    }
                }

                mModel.deselect();
                mMouseOp = MouseOperation::beginSelecting;

            }
        }

    }
}